

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O2

int stbtt__run_charstring(stbtt_fontinfo *info,int glyph_index,stbtt__csctx *c)

{
  byte bVar1;
  bool bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  stbtt_uint32 sVar6;
  stbtt_uint32 sVar7;
  ulong uVar8;
  long lVar9;
  int *piVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  uint i;
  float fVar16;
  float fVar17;
  float dx2;
  float dy3;
  float fVar18;
  float fVar19;
  stbtt__buf fontdict;
  stbtt__buf sVar20;
  stbtt__buf local_268;
  float local_24c;
  stbtt__buf local_248;
  ulong local_230;
  ulong local_228;
  int local_21c;
  undefined1 local_218 [8];
  undefined4 uStack_210;
  undefined4 uStack_20c;
  float local_208;
  uint uStack_204;
  uint uStack_200;
  uint uStack_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  float afStack_1d8 [2];
  stbtt_fontinfo *local_1d0;
  float s [48];
  stbtt__buf local_108;
  float local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  stbtt__buf *local_e8;
  int *local_e0;
  stbtt__buf subr_stack [10];
  
  local_108 = info->subrs;
  local_21c = glyph_index;
  local_248 = stbtt__cff_index_get(info->charstrings,glyph_index);
  uVar12 = local_248._8_8_;
  local_e8 = &info->fdselect;
  local_1d0 = info;
  local_e0 = &(info->gsubrs).cursor;
  uVar8 = uVar12 >> 0x20;
  bVar2 = false;
  uVar15 = 0;
  local_230 = 0;
  local_228 = 0;
  bVar5 = true;
LAB_00158748:
  iVar13 = (int)uVar12;
  if ((int)uVar8 <= iVar13) {
LAB_00159297:
    return 0;
  }
  lVar9 = (long)iVar13 + 1;
  iVar14 = (int)lVar9;
  local_248.cursor = iVar14;
  bVar1 = local_248.data[iVar13];
  uVar11 = (uint)uVar15;
  switch(bVar1) {
  case 1:
  case 3:
  case 0x12:
  case 0x17:
    local_228 = (ulong)(uint)((int)local_228 + (int)uVar11 / 2);
    break;
  case 2:
  case 9:
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
switchD_00158780_caseD_2:
    if (bVar1 < 0x20) {
      return 0;
    }
    if (bVar1 == 0xff) goto LAB_00158878;
  case 0x1c:
    stbtt__buf_skip(&local_248,-1);
    sVar6 = stbtt__cff_int(&local_248);
    fVar16 = (float)(int)(short)sVar6;
LAB_00158891:
    if (0x2f < (int)uVar11) {
      return 0;
    }
    uVar15 = (ulong)(uVar11 + 1);
    s[(int)uVar11] = fVar16;
    goto LAB_00158c7a;
  case 4:
    if ((int)uVar11 < 1) {
      return 0;
    }
    fVar17 = s[uVar11 - 1];
    fVar16 = 0.0;
    goto LAB_00158bb1;
  case 5:
    if ((int)uVar11 < 2) {
      return 0;
    }
    for (uVar8 = 1; uVar8 < uVar15; uVar8 = uVar8 + 2) {
      stbtt__csctx_rline_to(c,s[uVar8 - 1],s[uVar8]);
    }
    break;
  case 6:
    iVar13 = 0;
    if ((int)uVar11 < 1) {
      return 0;
    }
    for (; iVar13 < (int)uVar11; iVar13 = iVar13 + 1) {
      stbtt__csctx_rline_to(c,s[iVar13],0.0);
      iVar13 = iVar13 + 1;
LAB_0015926f:
      if ((int)uVar11 <= iVar13) break;
      stbtt__csctx_rline_to(c,0.0,s[iVar13]);
    }
    break;
  case 7:
    iVar13 = 0;
    if (0 < (int)uVar11) goto LAB_0015926f;
    return 0;
  case 8:
    if ((int)uVar11 < 6) {
      return 0;
    }
    for (uVar8 = 5; uVar8 < uVar15; uVar8 = uVar8 + 6) {
      stbtt__csctx_rccurve_to
                (c,afStack_1d8[uVar8 - 1],afStack_1d8[uVar8],afStack_1d8[uVar8 + 1],s[uVar8 - 2],
                 s[uVar8 - 1],s[uVar8]);
    }
    break;
  case 10:
    if (bVar2) {
      bVar2 = true;
    }
    else {
      bVar2 = true;
      if ((local_1d0->fdselect).size != 0) {
        local_268.data = local_e8->data;
        uVar3 = local_e8->cursor;
        uVar4 = local_e8->size;
        local_268.cursor = uVar3;
        local_268.size = uVar4;
        stbtt__buf_seek(&local_268,0);
        lVar9 = (long)local_268.cursor;
        if (local_268.cursor < local_268.size) {
          local_268.cursor = local_268.cursor + 1;
          if (local_268.data[lVar9] == '\x03') {
            sVar7 = stbtt__buf_get(&local_268,2);
            sVar6 = stbtt__buf_get(&local_268,2);
            if ((int)sVar7 < 1) {
              sVar7 = 0;
            }
            iVar13 = sVar7 + 1;
            do {
              iVar13 = iVar13 + -1;
              if (iVar13 == 0) {
                i = 0xffffffff;
                break;
              }
              lVar9 = (long)local_268.cursor;
              i = 0;
              if (local_268.cursor < local_268.size) {
                local_268.cursor = local_268.cursor + 1;
                i = (uint)local_268.data[lVar9];
              }
              sVar7 = stbtt__buf_get(&local_268,2);
              bVar2 = local_21c < (int)sVar6;
              sVar6 = sVar7;
            } while ((int)sVar7 <= local_21c || bVar2);
          }
          else {
            i = 0xffffffff;
            if (local_268.data[lVar9] == '\0') goto LAB_00158cec;
          }
        }
        else {
LAB_00158cec:
          stbtt__buf_skip(&local_268,local_21c);
          i = 0;
          if (local_268.cursor < local_268.size) {
            i = (uint)local_268.data[local_268.cursor];
          }
        }
        sVar20 = local_1d0->cff;
        fontdict = stbtt__cff_index_get(local_1d0->fontdicts,i);
        local_108 = stbtt__get_subrs(sVar20,fontdict);
        bVar2 = true;
      }
    }
  case 0x1d:
    sVar20 = local_248;
    if ((int)uVar11 < 1) {
      return 0;
    }
    iVar13 = (int)local_230;
    if (9 < iVar13) {
      return 0;
    }
    uVar15 = (ulong)(uVar11 - 1);
    fVar16 = s[uVar15];
    subr_stack[iVar13].data = local_248.data;
    subr_stack[iVar13].cursor = local_248.cursor;
    subr_stack[iVar13].size = local_248.size;
    local_268.data = local_108.data;
    piVar10 = &local_108.cursor;
    if (bVar1 != 10) {
      local_268.data = (local_1d0->gsubrs).data;
      piVar10 = local_e0;
    }
    local_268.cursor = (int)*(undefined8 *)piVar10;
    local_268.size = (int)((ulong)*(undefined8 *)piVar10 >> 0x20);
    local_248 = sVar20;
    stbtt__buf_seek(&local_268,0);
    sVar6 = stbtt__buf_get(&local_268,2);
    uVar11 = (uint)(0x4d7 < (int)sVar6) << 10 | 0x6b;
    if (0x846b < (int)sVar6) {
      uVar11 = 0x8000;
    }
    iVar13 = uVar11 + (int)fVar16;
    sVar20 = (stbtt__buf)ZEXT816(0);
    if (iVar13 < (int)sVar6 && -1 < iVar13) {
      sVar20.cursor = local_268.cursor;
      sVar20.data = local_268.data;
      sVar20.size = local_268.size;
      sVar20 = stbtt__cff_index_get(sVar20,iVar13);
    }
    if (sVar20._8_8_ >> 0x20 == 0) {
      return 0;
    }
    local_230 = (ulong)((int)local_230 + 1);
    local_248.size = sVar20.size;
    local_248.data = sVar20.data;
    local_248.cursor = 0;
    goto LAB_00158c7a;
  case 0xb:
    if ((int)local_230 < 1) {
      return 0;
    }
    local_230 = (ulong)((int)local_230 - 1);
    local_248.data._4_4_ = *(undefined4 *)((long)&subr_stack[local_230].data + 4);
    local_248.data._0_4_ = *(undefined4 *)&subr_stack[local_230].data;
    local_248.cursor = subr_stack[local_230].cursor;
    local_248.size = subr_stack[local_230].size;
    goto LAB_00158c7a;
  case 0xc:
    if ((int)uVar8 <= iVar14) {
      return 0;
    }
    local_248.cursor = iVar13 + 2;
    switch(local_248.data[lVar9]) {
    case '\"':
      if ((int)uVar11 < 7) {
        return 0;
      }
      _local_218 = ZEXT416((uint)s[2]);
      local_1f8 = CONCAT44(local_1f8._4_4_,s[4]);
      local_208 = s[5];
      local_1e8 = CONCAT44(local_1e8._4_4_,s[6]);
      stbtt__csctx_rccurve_to(c,s[0],0.0,s[1],s[2],s[3],0.0);
      fVar19 = -(float)local_218._0_4_;
      fVar18 = 0.0;
      dy3 = 0.0;
      fVar16 = (float)local_1e8;
      fVar17 = (float)local_1f8;
      dx2 = local_208;
      break;
    case '#':
      if ((int)uVar11 < 0xd) {
        return 0;
      }
      local_1e8 = CONCAT44(local_1e8._4_4_,s[6]);
      local_1f8 = CONCAT44(local_1f8._4_4_,s[7]);
      local_208 = s[8];
      local_218._0_4_ = s[9];
      local_f8 = s[10];
      local_24c = s[0xb];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar17 = (float)local_1e8;
      fVar18 = (float)local_1f8;
      fVar19 = (float)local_218._0_4_;
      dy3 = local_24c;
      dx2 = local_208;
      fVar16 = local_f8;
      break;
    case '$':
      if ((int)uVar11 < 9) {
        return 0;
      }
      local_f8 = s[1];
      uStack_f4 = 0;
      uStack_f0 = 0;
      uStack_ec = 0;
      local_24c = s[3];
      local_1e8 = CONCAT44(local_1e8._4_4_,s[5]);
      local_1f8 = CONCAT44(local_1f8._4_4_,s[6]);
      local_218._0_4_ = s[7];
      local_208 = s[8];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],0.0);
      dy3 = -(local_f8 + local_24c + (float)local_218._0_4_);
      fVar18 = 0.0;
      fVar17 = (float)local_1e8;
      fVar19 = (float)local_218._0_4_;
      dx2 = (float)local_1f8;
      fVar16 = local_208;
      break;
    case '%':
      if ((int)uVar11 < 0xb) {
        return 0;
      }
      local_1f8 = CONCAT44(s[7],s[6]);
      local_1e8 = CONCAT44(s[9],s[8]);
      uStack_1f0 = 0;
      uStack_1e0 = 0;
      fVar16 = s[0] + s[2] + s[4] + s[6] + s[8];
      fVar17 = s[1] + s[3] + s[5] + s[7] + s[9];
      fVar18 = ABS(fVar16);
      fVar19 = ABS(fVar17);
      local_218._4_4_ = 0.0;
      uStack_210 = 0;
      uStack_20c = 0;
      local_218._0_4_ = s[10];
      if (fVar18 <= fVar19) {
        uStack_210 = 0x80000000;
        uStack_20c = 0x80000000;
        local_218._0_4_ = -fVar16;
        local_218._4_4_ = -fVar17;
      }
      uVar11 = -(uint)(fVar19 < fVar18);
      uStack_204 = (uint)-fVar17 & (uint)fVar19;
      uStack_200 = (uint)-fVar17 & (uint)fVar19;
      uStack_1fc = (uint)-fVar17 & (uint)fVar19;
      local_208 = (float)(~uVar11 & (uint)s[10] | (uint)-fVar17 & uVar11);
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar17 = (float)local_1f8;
      fVar18 = local_1f8._4_4_;
      fVar19 = local_1e8._4_4_;
      dy3 = local_208;
      dx2 = (float)local_1e8;
      fVar16 = (float)local_218._0_4_;
      break;
    default:
      goto LAB_00159297;
    }
    goto LAB_00158c1d;
  case 0xe:
    stbtt__csctx_close_shape(c);
    return 1;
  case 0x13:
  case 0x14:
    if (bVar5) {
      local_228 = (ulong)(uint)((int)local_228 + (int)uVar11 / 2);
    }
    stbtt__buf_skip(&local_248,((int)local_228 + 7) / 8);
    goto LAB_00158c6f;
  case 0x15:
    if ((int)uVar11 < 2) {
      return 0;
    }
    fVar16 = s[uVar11 - 2];
    fVar17 = s[uVar11 - 1];
    goto LAB_00158bb1;
  case 0x16:
    if ((int)uVar11 < 1) {
      return 0;
    }
    fVar16 = s[uVar11 - 1];
    fVar17 = 0.0;
LAB_00158bb1:
    stbtt__csctx_rmove_to(c,fVar16,fVar17);
LAB_00158c6f:
    bVar5 = false;
    break;
  case 0x18:
    if ((int)uVar11 < 8) {
      return 0;
    }
    for (uVar8 = 5; uVar8 < uVar11 - 2; uVar8 = uVar8 + 6) {
      stbtt__csctx_rccurve_to
                (c,afStack_1d8[uVar8 - 1],afStack_1d8[uVar8],afStack_1d8[uVar8 + 1],s[uVar8 - 2],
                 s[uVar8 - 1],s[uVar8]);
    }
    if ((int)uVar11 <= (int)uVar8 + -4) {
      return 0;
    }
    stbtt__csctx_rline_to(c,afStack_1d8[uVar8 - 1],afStack_1d8[uVar8]);
    break;
  case 0x19:
    if ((int)uVar11 < 8) {
      return 0;
    }
    for (uVar8 = 2; uVar8 - 1 < (ulong)(uVar11 - 6); uVar8 = uVar8 + 2) {
      stbtt__csctx_rline_to(c,s[uVar8 - 2],s[uVar8 - 1]);
    }
    if ((int)uVar11 <= (int)(uVar8 + 3)) {
      return 0;
    }
    fVar17 = s[uVar8 - 2];
    fVar18 = s[uVar8 - 1];
    fVar19 = s[(int)uVar8 + 1];
    dy3 = s[uVar8 + 3 & 0xffffffff];
    dx2 = s[uVar8 & 0xffffffff];
    fVar16 = s[(int)uVar8 + 2];
LAB_00158c1d:
    stbtt__csctx_rccurve_to(c,fVar17,fVar18,dx2,fVar19,fVar16,dy3);
    break;
  case 0x1a:
  case 0x1b:
    if ((int)uVar11 < 4) {
      return 0;
    }
    fVar16 = 0.0;
    if ((uVar15 & 1) != 0) {
      fVar16 = s[0];
    }
    for (uVar8 = (ulong)(uVar11 & 1) + 3; uVar8 < uVar15; uVar8 = uVar8 + 4) {
      fVar17 = afStack_1d8[uVar8 + 1];
      if (bVar1 == 0x1b) {
        fVar19 = fVar17;
        fVar17 = fVar16;
        fVar16 = 0.0;
        fVar18 = s[uVar8];
      }
      else {
        fVar18 = 0.0;
        fVar19 = fVar16;
        fVar16 = s[uVar8];
      }
      stbtt__csctx_rccurve_to(c,fVar19,fVar17,s[uVar8 - 2],s[uVar8 - 1],fVar18,fVar16);
      fVar16 = 0.0;
    }
    break;
  case 0x1e:
    iVar14 = 0;
    if ((int)uVar11 < 4) {
      return 0;
    }
    while (iVar14 + 3 < (int)uVar11) {
      iVar13 = iVar14 + 4;
      fVar16 = 0.0;
      if (uVar11 - iVar14 == 5) {
        fVar16 = s[iVar13];
      }
      stbtt__csctx_rccurve_to
                (c,0.0,s[iVar14],s[(long)iVar14 + 1],s[(long)iVar14 + 2],s[iVar14 + 3],fVar16);
LAB_001591eb:
      if ((int)uVar11 <= iVar13 + 3) break;
      iVar14 = iVar13 + 4;
      fVar16 = 0.0;
      if (uVar11 - iVar13 == 5) {
        fVar16 = s[iVar14];
      }
      stbtt__csctx_rccurve_to
                (c,s[iVar13],0.0,s[(long)iVar13 + 1],s[(long)iVar13 + 2],fVar16,s[iVar13 + 3]);
    }
    break;
  case 0x1f:
    iVar13 = 0;
    if (3 < (int)uVar11) goto LAB_001591eb;
    return 0;
  default:
    if (bVar1 != 0xff) goto switchD_00158780_caseD_2;
LAB_00158878:
    sVar6 = stbtt__buf_get(&local_248,4);
    fVar16 = (float)(int)sVar6 * 1.5258789e-05;
    goto LAB_00158891;
  }
  uVar15 = 0;
LAB_00158c7a:
  uVar12 = (ulong)(uint)local_248.cursor;
  uVar8 = (ulong)(uint)local_248.size;
  goto LAB_00158748;
}

Assistant:

static int stbtt__run_charstring(const stbtt_fontinfo *info, int glyph_index, stbtt__csctx *c)
{
   int in_header = 1, maskbits = 0, subr_stack_height = 0, sp = 0, v, i, b0;
   int has_subrs = 0, clear_stack;
   float s[48];
   stbtt__buf subr_stack[10], subrs = info->subrs, b;
   float f;

#define STBTT__CSERR(s) (0)

   // this currently ignores the initial width value, which isn't needed if we have hmtx
   b = stbtt__cff_index_get(info->charstrings, glyph_index);
   while (b.cursor < b.size) {
      i = 0;
      clear_stack = 1;
      b0 = stbtt__buf_get8(&b);
      switch (b0) {
      // @TODO implement hinting
      case 0x13: // hintmask
      case 0x14: // cntrmask
         if (in_header)
            maskbits += (sp / 2); // implicit "vstem"
         in_header = 0;
         stbtt__buf_skip(&b, (maskbits + 7) / 8);
         break;

      case 0x01: // hstem
      case 0x03: // vstem
      case 0x12: // hstemhm
      case 0x17: // vstemhm
         maskbits += (sp / 2);
         break;

      case 0x15: // rmoveto
         in_header = 0;
         if (sp < 2) return STBTT__CSERR("rmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-2], s[sp-1]);
         break;
      case 0x04: // vmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("vmoveto stack");
         stbtt__csctx_rmove_to(c, 0, s[sp-1]);
         break;
      case 0x16: // hmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("hmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-1], 0);
         break;

      case 0x05: // rlineto
         if (sp < 2) return STBTT__CSERR("rlineto stack");
         for (; i + 1 < sp; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      // hlineto/vlineto and vhcurveto/hvcurveto alternate horizontal and vertical
      // starting from a different place.

      case 0x07: // vlineto
         if (sp < 1) return STBTT__CSERR("vlineto stack");
         goto vlineto;
      case 0x06: // hlineto
         if (sp < 1) return STBTT__CSERR("hlineto stack");
         for (;;) {
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, s[i], 0);
            i++;
      vlineto:
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, 0, s[i]);
            i++;
         }
         break;

      case 0x1F: // hvcurveto
         if (sp < 4) return STBTT__CSERR("hvcurveto stack");
         goto hvcurveto;
      case 0x1E: // vhcurveto
         if (sp < 4) return STBTT__CSERR("vhcurveto stack");
         for (;;) {
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, 0, s[i], s[i+1], s[i+2], s[i+3], (sp - i == 5) ? s[i + 4] : 0.0f);
            i += 4;
      hvcurveto:
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, s[i], 0, s[i+1], s[i+2], (sp - i == 5) ? s[i+4] : 0.0f, s[i+3]);
            i += 4;
         }
         break;

      case 0x08: // rrcurveto
         if (sp < 6) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x18: // rcurveline
         if (sp < 8) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp - 2; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         if (i + 1 >= sp) return STBTT__CSERR("rcurveline stack");
         stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      case 0x19: // rlinecurve
         if (sp < 8) return STBTT__CSERR("rlinecurve stack");
         for (; i + 1 < sp - 6; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         if (i + 5 >= sp) return STBTT__CSERR("rlinecurve stack");
         stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x1A: // vvcurveto
      case 0x1B: // hhcurveto
         if (sp < 4) return STBTT__CSERR("(vv|hh)curveto stack");
         f = 0.0;
         if (sp & 1) { f = s[i]; i++; }
         for (; i + 3 < sp; i += 4) {
            if (b0 == 0x1B)
               stbtt__csctx_rccurve_to(c, s[i], f, s[i+1], s[i+2], s[i+3], 0.0);
            else
               stbtt__csctx_rccurve_to(c, f, s[i], s[i+1], s[i+2], 0.0, s[i+3]);
            f = 0.0;
         }
         break;

      case 0x0A: // callsubr
         if (!has_subrs) {
            if (info->fdselect.size)
               subrs = stbtt__cid_get_glyph_subrs(info, glyph_index);
            has_subrs = 1;
         }
         // fallthrough
      case 0x1D: // callgsubr
         if (sp < 1) return STBTT__CSERR("call(g|)subr stack");
         v = (int) s[--sp];
         if (subr_stack_height >= 10) return STBTT__CSERR("recursion limit");
         subr_stack[subr_stack_height++] = b;
         b = stbtt__get_subr(b0 == 0x0A ? subrs : info->gsubrs, v);
         if (b.size == 0) return STBTT__CSERR("subr not found");
         b.cursor = 0;
         clear_stack = 0;
         break;

      case 0x0B: // return
         if (subr_stack_height <= 0) return STBTT__CSERR("return outside subr");
         b = subr_stack[--subr_stack_height];
         clear_stack = 0;
         break;

      case 0x0E: // endchar
         stbtt__csctx_close_shape(c);
         return 1;

      case 0x0C: { // two-byte escape
         float dx1, dx2, dx3, dx4, dx5, dx6, dy1, dy2, dy3, dy4, dy5, dy6;
         float dx, dy;
         int b1 = stbtt__buf_get8(&b);
         switch (b1) {
         // @TODO These "flex" implementations ignore the flex-depth and resolution,
         // and always draw beziers.
         case 0x22: // hflex
            if (sp < 7) return STBTT__CSERR("hflex stack");
            dx1 = s[0];
            dx2 = s[1];
            dy2 = s[2];
            dx3 = s[3];
            dx4 = s[4];
            dx5 = s[5];
            dx6 = s[6];
            stbtt__csctx_rccurve_to(c, dx1, 0, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, -dy2, dx6, 0);
            break;

         case 0x23: // flex
            if (sp < 13) return STBTT__CSERR("flex stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = s[10];
            dy6 = s[11];
            //fd is s[12]
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         case 0x24: // hflex1
            if (sp < 9) return STBTT__CSERR("hflex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dx4 = s[5];
            dx5 = s[6];
            dy5 = s[7];
            dx6 = s[8];
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, dy5, dx6, -(dy1+dy2+dy5));
            break;

         case 0x25: // flex1
            if (sp < 11) return STBTT__CSERR("flex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = dy6 = s[10];
            dx = dx1+dx2+dx3+dx4+dx5;
            dy = dy1+dy2+dy3+dy4+dy5;
            if (STBTT_fabs(dx) > STBTT_fabs(dy))
               dy6 = -dy;
            else
               dx6 = -dx;
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         default:
            return STBTT__CSERR("unimplemented");
         }
      } break;

      default:
         if (b0 != 255 && b0 != 28 && (b0 < 32 || b0 > 254)) //-V560
            return STBTT__CSERR("reserved operator");

         // push immediate
         if (b0 == 255) {
            f = (float)(stbtt_int32)stbtt__buf_get32(&b) / 0x10000;
         } else {
            stbtt__buf_skip(&b, -1);
            f = (float)(stbtt_int16)stbtt__cff_int(&b);
         }
         if (sp >= 48) return STBTT__CSERR("push stack overflow");
         s[sp++] = f;
         clear_stack = 0;
         break;
      }
      if (clear_stack) sp = 0;
   }
   return STBTT__CSERR("no endchar");

#undef STBTT__CSERR
}